

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::calc_dpdt(PeleLM *this,Real time,Real dt,MultiFab *dpdt)

{
  bool bVar1;
  int iVar2;
  FabArrayBase *fabarray_;
  FabArray<amrex::FArrayBox> *in_RSI;
  Geometry *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int in_stack_0000011c;
  int in_stack_00000120;
  int in_stack_00000124;
  Geometry *in_stack_00000128;
  MultiFab *in_stack_00000130;
  Array4<const_double> *P;
  Array4<double> *dPdt;
  Box *bx;
  MFIter mfi;
  MultiFab *S;
  TimeLevel whichTime;
  Real lev_0_curtime;
  Real lev_0_prevtime;
  StateData *state_data;
  AmrLevel *amr_lev;
  Real p_amb;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  Amr *in_stack_fffffffffffffda0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffda8;
  undefined1 cross;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffdb0;
  undefined1 *in_stack_fffffffffffffdb8;
  StateData *in_stack_fffffffffffffdc0;
  FabArray<amrex::FArrayBox> *this_00;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined1 local_208 [8];
  MFIter *in_stack_fffffffffffffe00;
  Real in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe14;
  AmrLevel *in_stack_fffffffffffffe18;
  undefined1 auStack_1c8 [64];
  Real local_188;
  double local_180;
  Real local_178;
  undefined1 local_170 [64];
  undefined1 *local_130;
  undefined1 local_128 [64];
  undefined1 *local_e8;
  undefined1 local_dc [28];
  undefined1 *local_c0;
  MFIter local_b8;
  FabArrayBase *local_58;
  TimeLevel local_4c;
  Real local_48;
  double local_40;
  StateData *local_38;
  AmrLevel *local_30;
  Real local_28;
  FabArray<amrex::FArrayBox> *local_20;
  double local_18;
  double local_10;
  
  local_28 = p_amb_old;
  local_20 = in_RSI;
  local_18 = in_XMM1_Qa;
  if (closed_chamber == 1) {
    local_10 = in_XMM0_Qa;
    local_30 = amrex::Amr::getLevel(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    local_38 = amrex::AmrLevel::get_state_data
                         ((AmrLevel *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    local_40 = amrex::StateData::prevTime((StateData *)in_stack_fffffffffffffdb0);
    local_48 = amrex::StateData::curTime(in_stack_fffffffffffffdc0);
    local_28 = ((local_48 - local_10) / (local_48 - local_40)) * p_amb_old +
               ((local_10 - local_40) / (local_48 - local_40)) * p_amb_new;
  }
  if ((local_18 <= 0.0) || (dpdt_factor <= 0.0)) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffda0,
               (value_type)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  else {
    local_4c = amrex::AmrLevel::which_time
                         (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                          in_stack_fffffffffffffe08);
    if (local_4c == AmrOldTime) {
      fabarray_ = (FabArrayBase *)
                  amrex::AmrLevel::get_old_data
                            ((AmrLevel *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    }
    else {
      fabarray_ = (FabArrayBase *)
                  amrex::AmrLevel::get_new_data
                            ((AmrLevel *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    }
    this_00 = local_20;
    local_58 = fabarray_;
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter((MFIter *)in_RDI,fabarray_,SUB81((ulong)this_00 >> 0x38,0));
    while( true ) {
      bVar1 = amrex::MFIter::isValid(&local_b8);
      if (!bVar1) break;
      amrex::MFIter::tilebox(in_stack_fffffffffffffe00);
      local_c0 = local_dc;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffda8,(MFIter *)in_stack_fffffffffffffda0);
      local_e8 = local_128;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffdb0,(MFIter *)in_stack_fffffffffffffda8,
                 (int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      local_130 = local_170;
      in_stack_fffffffffffffdb8 = local_c0;
      memcpy(local_208,local_e8,0x3c);
      memcpy(auStack_1c8,local_130,0x3c);
      local_188 = local_28;
      local_180 = local_18;
      local_178 = dpdt_factor;
      amrex::ParallelFor<PeleLM::calc_dpdt(double,double,amrex::MultiFab&)::__0>
                ((Box *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (anon_class_152_5_5bbdd72b *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      amrex::MFIter::operator++(&local_b8);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffda0);
    cross = (undefined1)((ulong)in_stack_fffffffffffffda8 >> 0x38);
    iVar2 = amrex::FabArrayBase::nGrow(&local_20->super_FabArrayBase,0);
    if (0 < iVar2) {
      amrex::Geometry::periodicity(in_RDI);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                (this_00,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                 (int)in_stack_fffffffffffffdb8,(Periodicity *)in_stack_fffffffffffffdb0,(bool)cross
                );
      amrex::FabArrayBase::nGrow(&local_20->super_FabArrayBase,0);
      amrex::Extrapolater::FirstOrderExtrap
                (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000120,
                 in_stack_0000011c);
    }
  }
  return;
}

Assistant:

void
PeleLM::calc_dpdt (Real      time,
                   Real      dt,
                   MultiFab& dpdt)
{
    BL_PROFILE("PLM::calc_dpdt()");

    // for open chambers, ambient pressure is constant in time
    Real p_amb = p_amb_old;

    if (closed_chamber == 1)
    {
        // for closed chambers, use piecewise-linear interpolation
        // we need level 0 prev and tnp1 for closed chamber algorithm
        AmrLevel& amr_lev = parent->getLevel(0);
        StateData& state_data = amr_lev.get_state_data(0);
        const Real lev_0_prevtime = state_data.prevTime();
        const Real lev_0_curtime = state_data.curTime();

        // linearly interpolate from level 0 ambient pressure
        p_amb = (lev_0_curtime - time )/(lev_0_curtime-lev_0_prevtime) * p_amb_old +
                (time - lev_0_prevtime)/(lev_0_curtime-lev_0_prevtime) * p_amb_new;
    }

    if (dt <= 0.0 || dpdt_factor <= 0)
    {
        dpdt.setVal(0);
        return;
    }

    const TimeLevel whichTime = which_time(State_Type, time);
    AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
    const MultiFab& S = (whichTime == AmrOldTime) ? get_old_data(State_Type) : get_new_data(State_Type);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dpdt,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& dPdt  = dpdt.array(mfi);
        auto const& P     = S.const_array(mfi,RhoRT);

        amrex::ParallelFor(bx, [dPdt, P, p_amb, dt, dpdt_fac = dpdt_factor]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           dPdt(i,j,k) = (P(i,j,k) - p_amb) / ( dt * P(i,j,k) ) * dpdt_fac;
        });
    }

    if (dpdt.nGrow() > 0) {
        dpdt.FillBoundary(0, 1, geom.periodicity());
        Extrapolater::FirstOrderExtrap(dpdt, geom, 0, 1, dpdt.nGrow());
    }
}